

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O2

bool __thiscall cmProcess::Buffer::GetLine(Buffer *this,string *line)

{
  const_iterator __first;
  size_type sVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  __first._M_current =
       (this->super_vector<char,_std::allocator<char>_>).
       super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  uVar4 = -this->Last;
  uVar5 = (long)__first._M_current -
          (long)(this->super_vector<char,_std::allocator<char>_>).
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish;
  sVar1 = this->Last;
  do {
    if (uVar5 == uVar4) {
      if (this->First != 0) {
        std::vector<char,_std::allocator<char>_>::erase
                  (&this->super_vector<char,_std::allocator<char>_>,__first,
                   (const_iterator)(__first._M_current + this->First));
        this->First = 0;
        this->Last = (long)(this->super_vector<char,_std::allocator<char>_>).
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->super_vector<char,_std::allocator<char>_>).
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
      }
LAB_001b7a33:
      return uVar5 != uVar4;
    }
    if ((__first._M_current[sVar1] == '\n') || (__first._M_current[sVar1] == '\0')) {
      lVar3 = -(this->First + uVar4);
      for (pcVar2 = __first._M_current + ~uVar4;
          (bVar6 = lVar3 != 0, lVar3 = lVar3 + -1, bVar6 && (*pcVar2 == '\r')); pcVar2 = pcVar2 + -1
          ) {
      }
      std::__cxx11::string::assign((char *)line,(ulong)(__first._M_current + this->First));
      sVar1 = this->Last + 1;
      this->Last = sVar1;
      this->First = sVar1;
      goto LAB_001b7a33;
    }
    this->Last = sVar1 + 1;
    uVar4 = uVar4 - 1;
    sVar1 = sVar1 + 1;
  } while( true );
}

Assistant:

bool cmProcess::Buffer::GetLine(std::string& line)
{
  // Scan for the next newline.
  for (size_type sz = this->size(); this->Last != sz; ++this->Last) {
    if ((*this)[this->Last] == '\n' || (*this)[this->Last] == '\0') {
      // Extract the range first..last as a line.
      const char* text = this->data() + this->First;
      size_type length = this->Last - this->First;
      while (length && text[length - 1] == '\r') {
        length--;
      }
      line.assign(text, length);

      // Start a new range for the next line.
      ++this->Last;
      this->First = Last;

      // Return the line extracted.
      return true;
    }
  }

  // Available data have been exhausted without a newline.
  if (this->First != 0) {
    // Move the partial line to the beginning of the buffer.
    this->erase(this->begin(), this->begin() + this->First);
    this->First = 0;
    this->Last = this->size();
  }
  return false;
}